

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int compress_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  char *pcVar1;
  int bits_checked;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  buffer = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  pcVar1 = (char *)__archive_read_filter_ahead(filter,3,(ssize_t *)&stack0xffffffffffffffd0);
  if (pcVar1 == (char *)0x0) {
    self_local._4_4_ = 0;
  }
  else if ((*pcVar1 == '\x1f') && (pcVar1[1] == -99)) {
    if ((pcVar1[2] & 0x20U) == 0) {
      if ((pcVar1[2] & 0x40U) == 0) {
        self_local._4_4_ = 0x12;
      }
      else {
        self_local._4_4_ = 0;
      }
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  else {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
compress_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	/* Shortest valid compress file is 3 bytes. */
	buffer = __archive_read_filter_ahead(filter, 3, &avail);

	if (buffer == NULL)
		return (0);

	bits_checked = 0;
	/* First two bytes are the magic value */
	if (buffer[0] != 0x1F || buffer[1] != 0x9D)
		return (0);
	/* Third byte holds compression parameters. */
	if (buffer[2] & 0x20) /* Reserved bit, must be zero. */
		return (0);
	if (buffer[2] & 0x40) /* Reserved bit, must be zero. */
		return (0);
	bits_checked += 18;

	return (bits_checked);
}